

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QGraphicsSceneEvent *event)

{
  bool bVar1;
  Type TVar2;
  Int IVar3;
  QDebug *o;
  QGraphicsSceneMouseEvent *this;
  QEvent *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneWheelEvent *we;
  QGraphicsSceneDragDropEvent *de;
  QGraphicsSceneContextMenuEvent *ce;
  MouseButton button;
  QGraphicsSceneMouseEvent *me;
  Type type;
  MouseButtons buttons;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff48;
  QDebug *in_stack_ffffffffffffff50;
  Stream *debug_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QDebug in_stack_ffffffffffffffc8;
  QDebug in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  debug_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  if (in_RDX == (QEvent *)0x0) {
    QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
    QDebug::QDebug(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    TVar2 = QEvent::type(in_RDX);
    this = (QGraphicsSceneMouseEvent *)(ulong)(TVar2 - GraphicsSceneMouseMove);
    switch(this) {
    case (QGraphicsSceneMouseEvent *)0x0:
    case (QGraphicsSceneMouseEvent *)0x1:
    case (QGraphicsSceneMouseEvent *)0x2:
    case (QGraphicsSceneMouseEvent *)0x3:
      QGraphicsSceneMouseEvent::button(this);
      local_14.super_QFlagsStorage<Qt::MouseButton>.i = (QFlagsStorage<Qt::MouseButton>)0xaaaaaaaa;
      local_14.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)QGraphicsSceneMouseEvent::buttons(this);
      QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QtDebugUtils::formatQEnum<QEvent::Type>(in_RSI,(Type)((ulong)debug_00 >> 0x20));
      if (TVar2 != GraphicsSceneMouseMove) {
        QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
        QtDebugUtils::formatQEnum<Qt::MouseButton>(in_RSI,(MouseButton)((ulong)debug_00 >> 0x20));
      }
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
      if ((IVar3 != 0) &&
         (bVar1 = operator!=((MouseButton)this,
                             (QFlagsStorageHelper<Qt::MouseButton,_4>)SUB84((ulong)in_RDI >> 0x20,0)
                            ), bVar1)) {
        QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
        QtDebugUtils::formatQFlags<Qt::MouseButton>(in_RSI,(QFlags<Qt::MouseButton> *)debug_00);
      }
      QGraphicsSceneMouseEvent::modifiers(this);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::KeyboardModifier> *)0xa23af6);
      formatPositions<QGraphicsSceneMouseEvent>
                ((QDebug *)debug_00,(QGraphicsSceneMouseEvent *)in_RDI);
      QGraphicsSceneMouseEvent::source(this);
      QtDebugUtils::formatNonNullQEnum<Qt::MouseEventSource>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,MouseEventNotSynthesized);
      QGraphicsSceneMouseEvent::flags(this);
      QtDebugUtils::formatNonNullQFlags<Qt::MouseEventFlag>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::MouseEventFlag> *)0xa23b4c);
      QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
      break;
    case (QGraphicsSceneMouseEvent *)0x4:
      in_stack_ffffffffffffff48 =
           QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QGraphicsSceneContextMenuEvent::reason((QGraphicsSceneContextMenuEvent *)this);
      QDebug::operator<<((QDebug *)this,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      QGraphicsSceneContextMenuEvent::modifiers((QGraphicsSceneContextMenuEvent *)this);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::KeyboardModifier> *)0xa23bbe);
      formatPositions<QGraphicsSceneContextMenuEvent>
                ((QDebug *)debug_00,(QGraphicsSceneContextMenuEvent *)in_RDI);
      QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
      break;
    case (QGraphicsSceneMouseEvent *)0x5:
    case (QGraphicsSceneMouseEvent *)0x6:
    case (QGraphicsSceneMouseEvent *)0x7:
      QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      formatPositions<QGraphicsSceneHoverEvent>
                ((QDebug *)debug_00,(QGraphicsSceneHoverEvent *)in_RDI);
      QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
      break;
    case (QGraphicsSceneMouseEvent *)0x8:
      break;
    case (QGraphicsSceneMouseEvent *)0x9:
    case (QGraphicsSceneMouseEvent *)0xa:
    case (QGraphicsSceneMouseEvent *)0xb:
    case (QGraphicsSceneMouseEvent *)0xc:
      QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QGraphicsSceneDragDropEvent::proposedAction((QGraphicsSceneDragDropEvent *)this);
      QtDebugUtils::formatQEnum<Qt::DropAction>(in_RSI,(DropAction)((ulong)debug_00 >> 0x20));
      QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QGraphicsSceneDragDropEvent::possibleActions((QGraphicsSceneDragDropEvent *)this);
      QtDebugUtils::formatQFlags<Qt::DropAction>(in_RSI,(QFlags<Qt::DropAction> *)debug_00);
      o = QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QDebug::QDebug((QDebug *)&stack0xffffffffffffffc8,o);
      QGraphicsSceneDragDropEvent::source((QGraphicsSceneDragDropEvent *)this);
      operator<<((QDebug *)in_stack_ffffffffffffffd0.stream,
                 (QWidget *)in_stack_ffffffffffffffc8.stream);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd0);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
      QGraphicsSceneDragDropEvent::buttons((QGraphicsSceneDragDropEvent *)this);
      QtDebugUtils::formatNonNullQFlags<Qt::MouseButton>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::MouseButton> *)0xa23d00);
      QGraphicsSceneDragDropEvent::modifiers((QGraphicsSceneDragDropEvent *)this);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::KeyboardModifier> *)0xa23d24);
      formatPositions<QGraphicsSceneDragDropEvent>
                ((QDebug *)debug_00,(QGraphicsSceneDragDropEvent *)in_RDI);
      break;
    case (QGraphicsSceneMouseEvent *)0xd:
      QDebug::operator<<(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,TVar2));
      QGraphicsSceneWheelEvent::buttons((QGraphicsSceneWheelEvent *)this);
      QtDebugUtils::formatNonNullQFlags<Qt::MouseButton>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::MouseButton> *)0xa23d77);
      QGraphicsSceneWheelEvent::modifiers((QGraphicsSceneWheelEvent *)this);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)this,(char *)in_stack_ffffffffffffff48,
                 (QFlags<Qt::KeyboardModifier> *)0xa23d9b);
      formatPositions<QGraphicsSceneWheelEvent>
                ((QDebug *)debug_00,(QGraphicsSceneWheelEvent *)in_RDI);
      QDebug::operator<<((QDebug *)this,(char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
    }
    QDebug::QDebug((QDebug *)this,in_stack_ffffffffffffff48);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)debug_00;
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsSceneEvent *event)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (!event) {
        debug << "QGraphicsSceneEvent(0)";
        return debug;
    }

    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick: {
        const QGraphicsSceneMouseEvent *me = static_cast<const QGraphicsSceneMouseEvent *>(event);
        const Qt::MouseButton button = me->button();
        const Qt::MouseButtons buttons = me->buttons();
        debug << "QGraphicsSceneMouseEvent(";
        QtDebugUtils::formatQEnum(debug, type);
        if (type != QEvent::GraphicsSceneMouseMove) {
            debug << ", ";
            QtDebugUtils::formatQEnum(debug, button);
        }
        if (buttons && button != buttons) {
            debug << ", buttons=";
            QtDebugUtils::formatQFlags(debug, buttons);
        }
        QtDebugUtils::formatNonNullQFlags(debug, ", ", me->modifiers());
        formatPositions(debug, me);
        QtDebugUtils::formatNonNullQEnum(debug, ", ", me->source());
        QtDebugUtils::formatNonNullQFlags(debug, ", flags=", me->flags());
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneContextMenu: {
        const QGraphicsSceneContextMenuEvent *ce = static_cast<const QGraphicsSceneContextMenuEvent *>(event);
        debug << "QGraphicsSceneContextMenuEvent(reason=" << ce->reason();
        QtDebugUtils::formatNonNullQFlags(debug, ", ", ce->modifiers());
        formatPositions(debug, ce);
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
        debug << "QGraphicsSceneHoverEvent(";
        formatPositions(debug, static_cast<const QGraphicsSceneHoverEvent *>(event));
        debug << ')';
        break;
    case QEvent::GraphicsSceneHelp:
        break;
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop: {
        const QGraphicsSceneDragDropEvent *de = static_cast<const QGraphicsSceneDragDropEvent *>(event);
        debug << "QGraphicsSceneDragDropEvent(proposedAction=";
        QtDebugUtils::formatQEnum(debug, de->proposedAction());
        debug << ", possibleActions=";
        QtDebugUtils::formatQFlags(debug, de->possibleActions());
        debug << ", source=" << de->source();
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", de->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", de->modifiers());
        formatPositions(debug, de);
    }
        break;
    case QEvent::GraphicsSceneWheel: {
        const QGraphicsSceneWheelEvent *we = static_cast<const QGraphicsSceneWheelEvent *>(event);
        debug << "QGraphicsSceneWheelEvent(";
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", we->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", we->modifiers());
        formatPositions(debug, we);
        debug << ')';
    }
        break;
    default:
        break;
    }
    return debug;
}